

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biasmultiply.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  duration<double,_std::ratio<1L,_1L>_> dVar5;
  duration<double,_std::ratio<1L,_1L>_> dVar6;
  duration<double,_std::ratio<1L,_1L>_> dVar7;
  duration<double,_std::ratio<1L,_1L>_> dVar8;
  duration<double,_std::ratio<1L,_1L>_> dVar9;
  duration<double,_std::ratio<1L,_1L>_> dVar10;
  double local_20;
  
  iVar1 = 1000;
  if (1 < argc) {
    iVar1 = atoi(argv[1]);
  }
  local_20 = (double)testOld_nobias<intgemm::SSSE3::Kernels8>(1,0x40,8);
  iVar3 = iVar1;
  if (0 < iVar1) {
    do {
      dVar5 = testOld_nobias<intgemm::SSSE3::Kernels8>(8,0x100,0x100);
      dVar6 = testOld_nobias<intgemm::SSSE3::Kernels8>(8,0x800,0x100);
      dVar7 = testOld_nobias<intgemm::SSSE3::Kernels8>(0x140,0x100,0x100);
      dVar8 = testOld_nobias<intgemm::SSSE3::Kernels8>(0x1d8,0x100,0x100);
      dVar9 = testOld_nobias<intgemm::SSSE3::Kernels8>(0xf8,0x100,0x100);
      dVar10 = testOld_nobias<intgemm::SSSE3::Kernels8>(200,0x100,0x100);
      local_20 = dVar10.__r + dVar9.__r + dVar8.__r + dVar7.__r + dVar6.__r + dVar5.__r + local_20;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," iterations of SSSE3 without bias took: ",0x28);
  poVar2 = std::ostream::_M_insert<double>(local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_20 = (double)testOld<intgemm::SSSE3::Kernels8>(1,0x40,8);
  iVar3 = iVar1;
  if (0 < iVar1) {
    do {
      dVar5 = testOld<intgemm::SSSE3::Kernels8>(8,0x100,0x100);
      dVar6 = testOld<intgemm::SSSE3::Kernels8>(8,0x800,0x100);
      dVar7 = testOld<intgemm::SSSE3::Kernels8>(0x140,0x100,0x100);
      dVar8 = testOld<intgemm::SSSE3::Kernels8>(0x1d8,0x100,0x100);
      dVar9 = testOld<intgemm::SSSE3::Kernels8>(0xf8,0x100,0x100);
      dVar10 = testOld<intgemm::SSSE3::Kernels8>(200,0x100,0x100);
      local_20 = dVar10.__r + dVar9.__r + dVar8.__r + dVar7.__r + dVar6.__r + dVar5.__r + local_20;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," iterations of SSSE3 took: ",0x1b);
  poVar2 = std::ostream::_M_insert<double>(local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_20 = (double)testOld<intgemm::SSSE3::Kernels8>(1,0x40,8);
  iVar3 = iVar1;
  if (0 < iVar1) {
    do {
      dVar5 = testNew<intgemm::SSSE3::Kernels8>(8,0x100,0x100);
      dVar6 = testNew<intgemm::SSSE3::Kernels8>(8,0x800,0x100);
      dVar7 = testNew<intgemm::SSSE3::Kernels8>(0x140,0x100,0x100);
      dVar8 = testNew<intgemm::SSSE3::Kernels8>(0x1d8,0x100,0x100);
      dVar9 = testNew<intgemm::SSSE3::Kernels8>(0xf8,0x100,0x100);
      dVar10 = testNew<intgemm::SSSE3::Kernels8>(200,0x100,0x100);
      local_20 = dVar10.__r + dVar9.__r + dVar8.__r + dVar7.__r + dVar6.__r + dVar5.__r + local_20;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," iterations of Shifted SSSE3 took: ",0x23);
  poVar2 = std::ostream::_M_insert<double>(local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_20 = (double)testOld_nobias<intgemm::AVX2::Kernels8>(1,0x40,8);
  iVar3 = iVar1;
  if (0 < iVar1) {
    do {
      dVar5 = testOld_nobias<intgemm::AVX2::Kernels8>(8,0x100,0x100);
      dVar6 = testOld_nobias<intgemm::AVX2::Kernels8>(8,0x800,0x100);
      dVar7 = testOld_nobias<intgemm::AVX2::Kernels8>(0x140,0x100,0x100);
      dVar8 = testOld_nobias<intgemm::AVX2::Kernels8>(0x1d8,0x100,0x100);
      dVar9 = testOld_nobias<intgemm::AVX2::Kernels8>(0xf8,0x100,0x100);
      dVar10 = testOld_nobias<intgemm::AVX2::Kernels8>(200,0x100,0x100);
      local_20 = dVar10.__r + dVar9.__r + dVar8.__r + dVar7.__r + dVar6.__r + dVar5.__r + local_20;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," iterations of AVX2 without bias took: ",0x27);
  poVar2 = std::ostream::_M_insert<double>(local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_20 = (double)testOld<intgemm::AVX2::Kernels8>(1,0x40,8);
  iVar3 = iVar1;
  if (0 < iVar1) {
    do {
      dVar5 = testOld<intgemm::AVX2::Kernels8>(8,0x100,0x100);
      dVar6 = testOld<intgemm::AVX2::Kernels8>(8,0x800,0x100);
      dVar7 = testOld<intgemm::AVX2::Kernels8>(0x140,0x100,0x100);
      dVar8 = testOld<intgemm::AVX2::Kernels8>(0x1d8,0x100,0x100);
      dVar9 = testOld<intgemm::AVX2::Kernels8>(0xf8,0x100,0x100);
      dVar10 = testOld<intgemm::AVX2::Kernels8>(200,0x100,0x100);
      local_20 = dVar10.__r + dVar9.__r + dVar8.__r + dVar7.__r + dVar6.__r + dVar5.__r + local_20;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," iterations of AVX2 took: ",0x1a);
  poVar2 = std::ostream::_M_insert<double>(local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_20 = (double)testOld<intgemm::AVX2::Kernels8>(1,0x40,8);
  iVar3 = iVar1;
  if (0 < iVar1) {
    do {
      dVar5 = testNew<intgemm::AVX2::Kernels8>(8,0x100,0x100);
      dVar6 = testNew<intgemm::AVX2::Kernels8>(8,0x800,0x100);
      dVar7 = testNew<intgemm::AVX2::Kernels8>(0x140,0x100,0x100);
      dVar8 = testNew<intgemm::AVX2::Kernels8>(0x1d8,0x100,0x100);
      dVar9 = testNew<intgemm::AVX2::Kernels8>(0xf8,0x100,0x100);
      dVar10 = testNew<intgemm::AVX2::Kernels8>(200,0x100,0x100);
      local_20 = dVar10.__r + dVar9.__r + dVar8.__r + dVar7.__r + dVar6.__r + dVar5.__r + local_20;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," iterations of Shifted AVX2 took: ",0x22);
  poVar2 = std::ostream::_M_insert<double>(local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  iVar3 = intgemm::kCPU;
  if (3 < intgemm::kCPU) {
    local_20 = (double)testOld_nobias<intgemm::AVX512BW::Kernels8>(1,0x40,8);
    iVar4 = iVar1;
    if (0 < iVar1) {
      do {
        dVar5 = testOld_nobias<intgemm::AVX512BW::Kernels8>(8,0x100,0x100);
        dVar6 = testOld_nobias<intgemm::AVX512BW::Kernels8>(8,0x800,0x100);
        dVar7 = testOld_nobias<intgemm::AVX512BW::Kernels8>(0x140,0x100,0x100);
        dVar8 = testOld_nobias<intgemm::AVX512BW::Kernels8>(0x1d8,0x100,0x100);
        dVar9 = testOld_nobias<intgemm::AVX512BW::Kernels8>(0xf8,0x100,0x100);
        dVar10 = testOld_nobias<intgemm::AVX512BW::Kernels8>(200,0x100,0x100);
        local_20 = dVar10.__r + dVar9.__r + dVar8.__r + dVar7.__r + dVar6.__r + dVar5.__r + local_20
        ;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," iterations of AVX512 without bias took: ",0x29);
    poVar2 = std::ostream::_M_insert<double>(local_20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    local_20 = (double)testOld<intgemm::AVX512BW::Kernels8>(1,0x40,8);
    iVar4 = iVar1;
    if (0 < iVar1) {
      do {
        dVar5 = testOld<intgemm::AVX512BW::Kernels8>(8,0x100,0x100);
        dVar6 = testOld<intgemm::AVX512BW::Kernels8>(8,0x800,0x100);
        dVar7 = testOld<intgemm::AVX512BW::Kernels8>(0x140,0x100,0x100);
        dVar8 = testOld<intgemm::AVX512BW::Kernels8>(0x1d8,0x100,0x100);
        dVar9 = testOld<intgemm::AVX512BW::Kernels8>(0xf8,0x100,0x100);
        dVar10 = testOld<intgemm::AVX512BW::Kernels8>(200,0x100,0x100);
        local_20 = dVar10.__r + dVar9.__r + dVar8.__r + dVar7.__r + dVar6.__r + dVar5.__r + local_20
        ;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," iterations of AVX512 took: ",0x1c);
    poVar2 = std::ostream::_M_insert<double>(local_20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    local_20 = (double)testOld<intgemm::AVX512BW::Kernels8>(1,0x40,8);
    iVar4 = iVar1;
    if (0 < iVar1) {
      do {
        dVar5 = testNew<intgemm::AVX512BW::Kernels8>(8,0x100,0x100);
        dVar6 = testNew<intgemm::AVX512BW::Kernels8>(8,0x800,0x100);
        dVar7 = testNew<intgemm::AVX512BW::Kernels8>(0x140,0x100,0x100);
        dVar8 = testNew<intgemm::AVX512BW::Kernels8>(0x1d8,0x100,0x100);
        dVar9 = testNew<intgemm::AVX512BW::Kernels8>(0xf8,0x100,0x100);
        dVar10 = testNew<intgemm::AVX512BW::Kernels8>(200,0x100,0x100);
        local_20 = dVar10.__r + dVar9.__r + dVar8.__r + dVar7.__r + dVar6.__r + dVar5.__r + local_20
        ;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," iterations of Shifted AVX512 took: ",0x24);
    poVar2 = std::ostream::_M_insert<double>(local_20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (iVar3 != 4) {
      local_20 = (double)testOld_nobias<intgemm::AVX512BW::Kernels8>(1,0x40,8);
      iVar3 = iVar1;
      if (0 < iVar1) {
        do {
          dVar5 = testOld_nobias<intgemm::AVX512VNNI::Kernels8>(8,0x100,0x100);
          dVar6 = testOld_nobias<intgemm::AVX512VNNI::Kernels8>(8,0x800,0x100);
          dVar7 = testOld_nobias<intgemm::AVX512VNNI::Kernels8>(0x140,0x100,0x100);
          dVar8 = testOld_nobias<intgemm::AVX512VNNI::Kernels8>(0x1d8,0x100,0x100);
          dVar9 = testOld_nobias<intgemm::AVX512VNNI::Kernels8>(0xf8,0x100,0x100);
          dVar10 = testOld_nobias<intgemm::AVX512VNNI::Kernels8>(200,0x100,0x100);
          local_20 = dVar10.__r +
                     dVar9.__r + dVar8.__r + dVar7.__r + dVar6.__r + dVar5.__r + local_20;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," iterations of AVX512VNNI without bias took: ",0x2d);
      poVar2 = std::ostream::_M_insert<double>(local_20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      local_20 = (double)testOld<intgemm::AVX512BW::Kernels8>(1,0x40,8);
      iVar3 = iVar1;
      if (0 < iVar1) {
        do {
          dVar5 = testOld<intgemm::AVX512VNNI::Kernels8>(8,0x100,0x100);
          dVar6 = testOld<intgemm::AVX512VNNI::Kernels8>(8,0x800,0x100);
          dVar7 = testOld<intgemm::AVX512VNNI::Kernels8>(0x140,0x100,0x100);
          dVar8 = testOld<intgemm::AVX512VNNI::Kernels8>(0x1d8,0x100,0x100);
          dVar9 = testOld<intgemm::AVX512VNNI::Kernels8>(0xf8,0x100,0x100);
          dVar10 = testOld<intgemm::AVX512VNNI::Kernels8>(200,0x100,0x100);
          local_20 = dVar10.__r +
                     dVar9.__r + dVar8.__r + dVar7.__r + dVar6.__r + dVar5.__r + local_20;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," iterations of AVX512VNNI took: ",0x20);
      poVar2 = std::ostream::_M_insert<double>(local_20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      local_20 = (double)testOld<intgemm::AVX512BW::Kernels8>(1,0x40,8);
      iVar3 = iVar1;
      if (0 < iVar1) {
        do {
          dVar5 = testNew<intgemm::AVX512VNNI::Kernels8>(8,0x100,0x100);
          dVar6 = testNew<intgemm::AVX512VNNI::Kernels8>(8,0x800,0x100);
          dVar7 = testNew<intgemm::AVX512VNNI::Kernels8>(0x140,0x100,0x100);
          dVar8 = testNew<intgemm::AVX512VNNI::Kernels8>(0x1d8,0x100,0x100);
          dVar9 = testNew<intgemm::AVX512VNNI::Kernels8>(0xf8,0x100,0x100);
          dVar10 = testNew<intgemm::AVX512VNNI::Kernels8>(200,0x100,0x100);
          local_20 = dVar10.__r +
                     dVar9.__r + dVar8.__r + dVar7.__r + dVar6.__r + dVar5.__r + local_20;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," iterations of Shifted AVX512VNNI took: ",0x28);
      poVar2 = std::ostream::_M_insert<double>(local_20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  }
  return 0;
}

Assistant:

int main(int argc, char ** argv) {
	int repeat = 1000;
	if (argc > 1) {
		repeat = atoi(argv[1]);
	}

	std::chrono::duration<double> oldSSSE3_nobias = testOld_nobias<SSSE3::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(8, 256, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(8, 2048, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(320, 256, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(472, 256, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(248, 256, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of SSSE3 without bias took: " << oldSSSE3_nobias.count() << " seconds." << std::endl;

	std::chrono::duration<double> oldSSSE3 = testOld<SSSE3::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldSSSE3 += testOld<SSSE3::Kernels8>(8, 256, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(8, 2048, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(320, 256, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(472, 256, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(248, 256, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of SSSE3 took: " << oldSSSE3.count() << " seconds." << std::endl;

	std::chrono::duration<double> newTimeSSSE3 = testOld<SSSE3::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(8, 256, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(8, 2048, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(320, 256, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(472, 256, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(248, 256, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of Shifted SSSE3 took: " << newTimeSSSE3.count() << " seconds." << std::endl;

#ifdef INTGEMM_COMPILER_SUPPORTS_AVX2
	std::chrono::duration<double> oldAVX2_nobias = testOld_nobias<AVX2::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(8, 256, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(8, 2048, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(320, 256, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(472, 256, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(248, 256, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of AVX2 without bias took: " << oldAVX2_nobias.count() << " seconds." << std::endl;

	std::chrono::duration<double> oldAVX2 = testOld<AVX2::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldAVX2 += testOld<AVX2::Kernels8>(8, 256, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(8, 2048, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(320, 256, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(472, 256, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(248, 256, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of AVX2 took: " << oldAVX2.count() << " seconds." << std::endl;

	std::chrono::duration<double> newTimeAVX2 = testOld<AVX2::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		newTimeAVX2 += testNew<AVX2::Kernels8>(8, 256, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(8, 2048, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(320, 256, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(472, 256, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(248, 256, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of Shifted AVX2 took: " << newTimeAVX2.count() << " seconds." << std::endl;
#endif
#ifdef INTGEMM_COMPILER_SUPPORTS_AVX512BW
	if (kCPU < CPUType::AVX512BW) return 0;
	std::chrono::duration<double> oldAVX512_nobias = testOld_nobias<AVX512BW::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(8, 256, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(8, 2048, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(320, 256, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(472, 256, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(248, 256, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of AVX512 without bias took: " << oldAVX512_nobias.count() << " seconds." << std::endl;

	std::chrono::duration<double> oldAVX512 = testOld<AVX512BW::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldAVX512 += testOld<AVX512BW::Kernels8>(8, 256, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(8, 2048, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(320, 256, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(472, 256, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(248, 256, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of AVX512 took: " << oldAVX512.count() << " seconds." << std::endl;

	std::chrono::duration<double> newTimeAVX512 = testOld<AVX512BW::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(8, 256, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(8, 2048, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(320, 256, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(472, 256, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(248, 256, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of Shifted AVX512 took: " << newTimeAVX512.count() << " seconds." << std::endl;
#endif
#ifdef INTGEMM_COMPILER_SUPPORTS_AVX512VNNI
  if (kCPU < CPUType::AVX512VNNI) return 0;
  std::chrono::duration<double> oldAVX512VNNI_nobias = testOld_nobias<AVX512BW::Kernels8>(1, 64, 8);
  for (int i = 0; i<repeat; i++) {
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(8, 256, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(8, 2048, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(320, 256, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(472, 256, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(248, 256, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(200, 256, 256);
  }

  std::cout << repeat << " iterations of AVX512VNNI without bias took: " << oldAVX512VNNI_nobias.count() << " seconds." << std::endl;

  std::chrono::duration<double> oldAVX512VNNI = testOld<AVX512BW::Kernels8>(1, 64, 8);
  for (int i = 0; i<repeat; i++) {
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(8, 256, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(8, 2048, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(320, 256, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(472, 256, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(248, 256, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(200, 256, 256);
  }

  std::cout << repeat << " iterations of AVX512VNNI took: " << oldAVX512VNNI.count() << " seconds." << std::endl;

  std::chrono::duration<double> newTimeAVX512VNNI = testOld<AVX512BW::Kernels8>(1, 64, 8);
  for (int i = 0; i<repeat; i++) {
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(8, 256, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(8, 2048, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(320, 256, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(472, 256, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(248, 256, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(200, 256, 256);
  }

  std::cout << repeat << " iterations of Shifted AVX512VNNI took: " << newTimeAVX512VNNI.count() << " seconds." << std::endl;
#endif

}